

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O3

void __thiscall sglr::GLContext::genBuffers(GLContext *this,int numBuffers,deUint32 *buffers)

{
  long lVar1;
  _Alloc_node __an;
  _Alloc_node local_38;
  
  glu::CallLogWrapper::glGenBuffers(this->m_wrapper,numBuffers,buffers);
  if (0 < numBuffers) {
    lVar1 = (ulong)(uint)numBuffers << 2;
    local_38._M_t = &(this->m_allocatedBuffers)._M_t;
    do {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::
      _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&this->m_allocatedBuffers,
                 (const_iterator)&(this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header,
                 buffers,&local_38);
      buffers = buffers + 1;
      lVar1 = lVar1 + -4;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void GLContext::genBuffers (int numBuffers, deUint32* buffers)
{
	m_wrapper->glGenBuffers(numBuffers, buffers);
	if (numBuffers > 0)
		m_allocatedBuffers.insert(buffers, buffers+numBuffers);
}